

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int fits_translate_keywords
              (fitsfile *infptr,fitsfile *outfptr,int firstkey,char *(*patterns) [2],int npat,
              int n_value,int n_offset,int n_range,int *status)

{
  size_t sVar1;
  bool bVar2;
  int local_130;
  int local_12c;
  int nkeys1;
  int i1;
  char outrec [81];
  int ii;
  int maxchr;
  int pat_num;
  int m;
  int n;
  int j;
  int i;
  char rec [81];
  int nmore;
  int nkeys;
  int nrec;
  int n_value_local;
  int npat_local;
  char *(*patterns_local) [2];
  int firstkey_local;
  fitsfile *outfptr_local;
  fitsfile *infptr_local;
  
  n = 0;
  m = 0;
  pat_num = 0;
  maxchr = 0;
  ii = 0;
  if (*status < 1) {
    ffghsp(infptr,(int *)(rec + 0x50),(int *)(rec + 0x4c),status);
    for (nmore = firstkey; *status == 0 && nmore <= stack0xffffffffffffffa0; nmore = nmore + 1) {
      nkeys1._0_1_ = '\0';
      ffgrec(infptr,nmore,(char *)&j,status);
      sVar1 = strlen((char *)&j);
      register0x00000000 = (int)sVar1;
      outrec[0x4c] = '\b';
      outrec[0x4d] = '\0';
      outrec[0x4e] = '\0';
      outrec[0x4f] = '\0';
      for (; (int)outrec._76_4_ < register0x00000000; outrec._76_4_ = outrec._76_4_ + 1) {
        if ((*(char *)((long)&j + (long)(int)outrec._76_4_) < ' ') ||
           ('~' < *(char *)((long)&j + (long)(int)outrec._76_4_))) {
          *(undefined1 *)((long)&j + (long)(int)outrec._76_4_) = 0x20;
        }
      }
      fits_translate_keyword
                ((char *)&j,(char *)&nkeys1,patterns,npat,n_value,n_offset,n_range,&ii,&n,&m,&maxchr
                 ,&pat_num,status);
      if (*status == 0) {
        if ((char)nkeys1 == '-') {
          outrec[1] = '\0';
          local_12c = 8;
          while( true ) {
            bVar2 = false;
            if (1 < local_12c) {
              bVar2 = *(char *)((long)&nkeys1 + (long)local_12c) == ' ';
            }
            if (!bVar2) break;
            *(undefined1 *)((long)&nkeys1 + (long)local_12c) = 0;
            local_12c = local_12c + -1;
          }
          ffpmrk();
          ffdkey(outfptr,(char *)((long)&nkeys1 + 1),status);
          if ((*status == 0) &&
             (ffghsp(infptr,&local_130,(int *)(rec + 0x4c),status),
             local_130 != stack0xffffffffffffffa0)) {
            nmore = nmore + -1;
            stack0xffffffffffffffa0 = local_130;
          }
          *status = 0;
          ffcmrk();
        }
        else if ((char)nkeys1 != '\0') {
          ffprec(outfptr,(char *)&nkeys1,status);
        }
      }
      rec[0] = '\0';
      outrec[0] = '\0';
    }
    infptr_local._4_4_ = *status;
  }
  else {
    infptr_local._4_4_ = *status;
  }
  return infptr_local._4_4_;
}

Assistant:

int fits_translate_keywords(
	   fitsfile *infptr,   /* I - pointer to input HDU */
	   fitsfile *outfptr,  /* I - pointer to output HDU */
	   int firstkey,       /* I - first HDU record number to start with */
	   char *patterns[][2],/* I - pointer to input / output keyword templates */
	   int npat,           /* I - number of templates passed */
	   int n_value,        /* I - base 'n' template value of interest */
	   int n_offset,       /* I - offset to be applied to the 'n' */
 	                       /*     value in the output string */
	   int n_range,        /* I - controls range of 'n' template */
	                       /*     values of interest (-1,0, or +1) */
           int *status)        /* IO - error status */
/*
     Copy relevant keywords from the table header into the newly
     created primary array header.  Convert names of keywords where
     appropriate.  See fits_translate_keyword() for the definitions.

     Translation begins at header record number 'firstkey', and
     continues to the end of the header.

  This routine was written by Craig Markwardt, GSFC
*/
{
    int nrec, nkeys, nmore;
    char rec[FLEN_CARD];
    int i = 0, j = 0, n = 0, m = 0;
    int pat_num = 0, maxchr, ii;
    char outrec[FLEN_CARD];

    if (*status > 0)
        return(*status);

    ffghsp(infptr, &nkeys, &nmore, status);  /* get number of keywords */

    for (nrec = firstkey; (*status == 0) && (nrec <= nkeys); nrec++) {
      outrec[0] = '\0';

      ffgrec(infptr, nrec, rec, status);

      /* silently overlook any illegal ASCII characters in the value or */
      /* comment fields of the record. It is usually not appropriate to */
      /* abort the process because of this minor transgression of the FITS rules. */
      /* Set the offending character to a blank */

      maxchr = strlen(rec);
      for (ii = 8; ii < maxchr; ii++)
      {
        if (rec[ii] < 32 || rec[ii] > 126)
          rec[ii] = ' ';
      }
      
      fits_translate_keyword(rec, outrec, patterns, npat, 
			     n_value, n_offset, n_range, 
			     &pat_num, &i, &j, &m, &n, status);
      
      if (*status == 0) {
	if (outrec[0] == '-') { /* prefix -KEYNAME means delete */
	  int i1;

	  /* Preserve only the keyword portion of name */
	  outrec[9] = 0;
	  for(i1=8; i1>1 && outrec[i1] == ' '; i1--) outrec[i1] = 0;

	  ffpmrk();
	  ffdkey(outfptr, outrec+1, status); /* delete the keyword */
	  if (*status == 0) {
	    int nkeys1;
	    /* get number of keywords again in case of change*/
	    ffghsp(infptr, &nkeys1, &nmore, status);  
	    if (nkeys1 != nkeys) {
	      nrec --;
	      nkeys = nkeys1;
	    }
	  }
	  *status = 0;
	  ffcmrk();

	} else if (outrec[0]) {
	  ffprec(outfptr, outrec, status); /* copy the keyword */
	}	  
      }
      rec[8] = 0; outrec[8] = 0;

    }	

    return(*status);
}